

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::auxDefineFlows(Graph *this,Vertex *v,Vertex *v_previous)

{
  Edge *pEVar1;
  Vertex *v_00;
  
  if (v == (Vertex *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n No NULL \n",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    return;
  }
  pEVar1 = v->edgesList;
  do {
    if (pEVar1 == (Edge *)0x0) {
      return;
    }
    v_00 = pEVar1->destiny;
    if (pEVar1->closed == true) {
      if (v_00 == v_previous) {
        pEVar1->activePowerFlow = 0.0;
        pEVar1->reactivePowerFlow = 0.0;
        pEVar1->activeLoss = 0.0;
        pEVar1->reactiveLoss = 0.0;
LAB_00103cbd:
        pEVar1->closed = false;
      }
      else {
        auxDefineFlows(this,v_00,v);
      }
    }
    else {
      pEVar1->activePowerFlow = 0.0;
      pEVar1->reactivePowerFlow = 0.0;
      pEVar1->activeLoss = 0.0;
      pEVar1->reactiveLoss = 0.0;
      if (v_00 == v_previous) goto LAB_00103cbd;
    }
    pEVar1 = pEVar1->nextEdge;
  } while( true );
}

Assistant:

void Graph::auxDefineFlows(Vertex *v, Vertex *v_previous){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){

            //nao descer por arcos com chave aberta e descer no sentido correto
            //e->getNoDestino()==v e o arco de volta do arco 'a' assim nao passamos por ele
            while(e!=NULL && (e->isClosed() == false || e->getDestiny()==v_previous) ){

                //nao tem fluxo nem perda em arcos abertos
                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                if(e->getDestiny()==v_previous)
                    e->setSwitch(false);

                e = e->getNext();
            }
            if(e==NULL)     break;

            auxDefineFlows(e->getDestiny(), v);
        }
    }
}